

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 ExprVerifyNodes(jx9_gen_state *pGen,jx9_expr_node **apNode,sxi32 nNode)

{
  jx9_expr_op *pjVar1;
  bool bVar2;
  uint local_48;
  int local_44;
  sxu32 n;
  sxi32 iExprOp;
  jx9_expr_op *pOp;
  sxi32 rc;
  sxi32 i;
  sxi32 iBraces;
  sxi32 iSquare;
  sxi32 iParen;
  sxi32 nNode_local;
  jx9_expr_node **apNode_local;
  jx9_gen_state *pGen_local;
  
  if (((0 < nNode) && ((*apNode)->pOp != (jx9_expr_op *)0x0)) &&
     (((*apNode)->pOp->iOp == 0x10 || ((*apNode)->pOp->iOp == 0x11)))) {
    pjVar1 = jx9ExprExtractOperator(&(*apNode)->pStart->sData,(SyToken *)0x0);
    (*apNode)->pOp = pjVar1;
    (*apNode)->pStart->pUserData = (*apNode)->pOp;
  }
  rc = 0;
  i = 0;
  iBraces = 0;
  pOp._4_4_ = 0;
  do {
    if (nNode <= pOp._4_4_) {
      if (((iBraces == 0) && (i == 0)) && (rc == 0)) {
        pGen_local._4_4_ = 0;
      }
      else {
        pOp._0_4_ = jx9GenCompileError(pGen,1,(*apNode)->pStart->nLine,
                                       "Syntax error, mismatched \'(\', \'[\' or \'{\'");
        if ((sxi32)pOp != -10) {
          pOp._0_4_ = -0xc;
        }
        pGen_local._4_4_ = (sxi32)pOp;
      }
      return pGen_local._4_4_;
    }
    if ((apNode[pOp._4_4_]->pStart->nType & 0x200) == 0) {
      if ((apNode[pOp._4_4_]->pStart->nType & 0x400) == 0) {
        if (((apNode[pOp._4_4_]->pStart->nType & 0x800) == 0) ||
           (apNode[pOp._4_4_]->xCode != (ProcNodeConstruct)0x0)) {
          if ((apNode[pOp._4_4_]->pStart->nType & 0x1000) == 0) {
            if (((apNode[pOp._4_4_]->pStart->nType & 0x40) == 0) ||
               (apNode[pOp._4_4_]->xCode != (ProcNodeConstruct)0x0)) {
              if ((apNode[pOp._4_4_]->pStart->nType & 0x80) == 0) {
                if (((((apNode[pOp._4_4_]->pStart->nType & 0x20) != 0) &&
                     (pjVar1 = apNode[pOp._4_4_]->pOp, 0 < pOp._4_4_)) &&
                    ((pjVar1->iOp == 7 || (pjVar1->iOp == 8)))) &&
                   ((apNode[pOp._4_4_ + -1]->xCode == jx9CompileVariable ||
                    (apNode[pOp._4_4_ + -1]->xCode == jx9CompileLiteral)))) {
                  local_44 = 0x11;
                  local_48 = 0;
                  if (pjVar1->iOp == 8) {
                    local_44 = 0x10;
                  }
                  while( true ) {
                    bVar2 = false;
                    if (local_48 < 0x32) {
                      bVar2 = aOpTable[local_48].iOp != local_44;
                    }
                    if (!bVar2) break;
                    local_48 = local_48 + 1;
                  }
                  apNode[pOp._4_4_]->pOp = aOpTable + local_48;
                  apNode[pOp._4_4_]->pStart->pUserData = aOpTable + local_48;
                }
              }
              else {
                if (rc < 1) {
                  pOp._0_4_ = jx9GenCompileError(pGen,1,apNode[pOp._4_4_]->pStart->nLine,
                                                 "Syntax error: Unexpected token \'}\'");
                  if ((sxi32)pOp != -10) {
                    pOp._0_4_ = -0xc;
                  }
                  return (sxi32)pOp;
                }
                rc = rc + -1;
              }
            }
            else {
              rc = rc + 1;
            }
          }
          else {
            if (i < 1) {
              pOp._0_4_ = jx9GenCompileError(pGen,1,apNode[pOp._4_4_]->pStart->nLine,
                                             "Syntax error: Unexpected token \']\'");
              if ((sxi32)pOp != -10) {
                pOp._0_4_ = -0xc;
              }
              return (sxi32)pOp;
            }
            i = i + -1;
          }
        }
        else {
          i = i + 1;
        }
      }
      else {
        if (iBraces < 1) {
          pOp._0_4_ = jx9GenCompileError(pGen,1,apNode[pOp._4_4_]->pStart->nLine,
                                         "Syntax error: Unexpected token \')\'");
          if ((sxi32)pOp != -10) {
            pOp._0_4_ = -0xc;
          }
          return (sxi32)pOp;
        }
        iBraces = iBraces + -1;
      }
    }
    else {
      if (((0 < pOp._4_4_) &&
          (((apNode[pOp._4_4_ + -1]->xCode == jx9CompileVariable ||
            (apNode[pOp._4_4_ + -1]->xCode == jx9CompileLiteral)) ||
           ((apNode[pOp._4_4_ + -1]->pStart->nType & 0x740c) != 0)))) &&
         ((apNode[pOp._4_4_ + -1]->pStart->nType & 0x20) == 0)) {
        apNode[pOp._4_4_]->pStart->nType = apNode[pOp._4_4_]->pStart->nType | 0x20;
        apNode[pOp._4_4_]->pStart->pUserData = &sFCallOp;
        apNode[pOp._4_4_]->pOp = &sFCallOp;
      }
      iBraces = iBraces + 1;
    }
    pOp._4_4_ = pOp._4_4_ + 1;
  } while( true );
}

Assistant:

static sxi32 ExprVerifyNodes(jx9_gen_state *pGen, jx9_expr_node **apNode, sxi32 nNode)
{
	sxi32 iParen, iSquare, iBraces;
	sxi32 i, rc;

	if( nNode > 0 && apNode[0]->pOp && (apNode[0]->pOp->iOp == EXPR_OP_ADD || apNode[0]->pOp->iOp == EXPR_OP_SUB) ){
		/* Fix and mark as an unary not binary plus/minus operator */
		apNode[0]->pOp = jx9ExprExtractOperator(&apNode[0]->pStart->sData, 0);
		apNode[0]->pStart->pUserData = (void *)apNode[0]->pOp;
	}
	iParen = iSquare = iBraces = 0;
	for( i = 0 ; i < nNode ; ++i ){
		if( apNode[i]->pStart->nType & JX9_TK_LPAREN /*'('*/){
			if( i > 0 && ( apNode[i-1]->xCode == jx9CompileVariable || apNode[i-1]->xCode == jx9CompileLiteral ||
				(apNode[i - 1]->pStart->nType & (JX9_TK_ID|JX9_TK_KEYWORD|JX9_TK_SSTR|JX9_TK_DSTR|JX9_TK_RPAREN/*')'*/|JX9_TK_CSB/*]*/))) ){
					/* Ticket 1433-033: Take care to ignore alpha-stream [i.e: or, xor] operators followed by an opening parenthesis */
					if( (apNode[i - 1]->pStart->nType & JX9_TK_OP) == 0 ){
						/* We are dealing with a postfix [i.e: function call]  operator
						 * not a simple left parenthesis. Mark the node.
						 */
						apNode[i]->pStart->nType |= JX9_TK_OP;
						apNode[i]->pStart->pUserData = (void *)&sFCallOp; /* Function call operator */
						apNode[i]->pOp = &sFCallOp;
					}
			}
			iParen++;
		}else if( apNode[i]->pStart->nType & JX9_TK_RPAREN/*')*/){
			if( iParen <= 0 ){
				rc = jx9GenCompileError(&(*pGen), E_ERROR, apNode[i]->pStart->nLine, "Syntax error: Unexpected token ')'");
				if( rc != SXERR_ABORT ){
					rc = SXERR_SYNTAX;
				}
				return rc;
			}
			iParen--;
		}else if( apNode[i]->pStart->nType & JX9_TK_OSB /*'['*/ && apNode[i]->xCode == 0 ){
			iSquare++;
		}else if (apNode[i]->pStart->nType & JX9_TK_CSB /*']'*/){
			if( iSquare <= 0 ){
				rc = jx9GenCompileError(&(*pGen), E_ERROR, apNode[i]->pStart->nLine, "Syntax error: Unexpected token ']'");
				if( rc != SXERR_ABORT ){
					rc = SXERR_SYNTAX;
				}
				return rc;
			}
			iSquare--;
		}else if( apNode[i]->pStart->nType & JX9_TK_OCB /*'{'*/ && apNode[i]->xCode == 0 ){
			iBraces++;
		}else if (apNode[i]->pStart->nType & JX9_TK_CCB /*'}'*/){
			if( iBraces <= 0 ){
				rc = jx9GenCompileError(&(*pGen), E_ERROR, apNode[i]->pStart->nLine, "Syntax error: Unexpected token '}'");
				if( rc != SXERR_ABORT ){
					rc = SXERR_SYNTAX;
				}
				return rc;
			}
			iBraces--;
		}else if( apNode[i]->pStart->nType & JX9_TK_OP ){
			const jx9_expr_op *pOp = (const jx9_expr_op *)apNode[i]->pOp;
			if( i > 0 && (pOp->iOp == EXPR_OP_UMINUS || pOp->iOp == EXPR_OP_UPLUS)){
				if( apNode[i-1]->xCode == jx9CompileVariable || apNode[i-1]->xCode == jx9CompileLiteral ){
					sxi32 iExprOp = EXPR_OP_SUB; /* Binary minus */
					sxu32 n = 0;
					if( pOp->iOp == EXPR_OP_UPLUS ){
						iExprOp = EXPR_OP_ADD; /* Binary plus */
					}
					/*
					 * TICKET 1433-013: This is a fix around an obscure bug when the user uses
					 * a variable name which is an alpha-stream operator [i.e: $and, $xor, $eq..].
					 */
					while( n < SX_ARRAYSIZE(aOpTable) && aOpTable[n].iOp != iExprOp ){
						++n;
					}
					pOp = &aOpTable[n];
					/* Mark as binary '+' or '-', not an unary */
					apNode[i]->pOp = pOp;
					apNode[i]->pStart->pUserData = (void *)pOp;
				}
			}
		}
	}
	if( iParen != 0 || iSquare != 0 || iBraces != 0){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, apNode[0]->pStart->nLine, "Syntax error, mismatched '(', '[' or '{'");
		if( rc != SXERR_ABORT ){
			rc = SXERR_SYNTAX;
		}
		return rc;
	}
	return SXRET_OK;
}